

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uchar lhs,SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  uchar ret;
  byte local_12;
  uchar local_11;
  unsigned_long local_10;
  
  local_12 = 0;
  local_11 = lhs;
  local_10 = rhs.m_int;
  DivisionHelper<unsigned_char,_unsigned_long,_0>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_11,&local_10,&local_12);
  return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         (ulong)local_12;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}